

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

ostream * yyml::operator<<(ostream *os,Tensor<double> *v)

{
  ostream *poVar1;
  ulong local_20;
  size_t i;
  Tensor<double> *v_local;
  ostream *os_local;
  
  for (local_20 = 0; local_20 < (v->shape_).total - 1; local_20 = local_20 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(os,v->data_[local_20]);
    std::operator<<(poVar1,' ');
  }
  std::ostream::operator<<(os,v->data_[local_20]);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Tensor& v) {
    size_t i;
    for (i = 0; i < v.shape_.total - 1; i++) {
      os << v.data_[i] << ' ';
    }
    os << v.data_[i];
    return os;
  }